

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::SetSuccessor
          (PathTypeHandlerBase *this,DynamicType *type,PathTypeSuccessorKey successorKey,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  DynamicType *pDVar4;
  DynamicTypeHandler *pDVar5;
  PathTypeHandlerBase *this_00;
  undefined4 *puVar6;
  PathTypeSuccessorInfo **ppPVar7;
  PathTypeSingleSuccessorInfo *ptr;
  PathTypeSuccessorInfo *this_01;
  DynamicType *successorType;
  ScriptContext *scriptContext_local;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef_local;
  DynamicType *type_local;
  PathTypeHandlerBase *this_local;
  PathTypeSuccessorKey successorKey_local;
  
  pDVar4 = Memory::RecyclerWeakReference<Js::DynamicType>::Get(typeWeakRef);
  if (pDVar4 != (DynamicType *)0x0) {
    pDVar5 = DynamicType::GetTypeHandler(pDVar4);
    iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[0x4e])();
    if (iVar3 != 0) {
      pDVar5 = DynamicType::GetTypeHandler(pDVar4);
      this_00 = FromTypeHandler(pDVar5);
      pDVar4 = GetPredecessorType(this_00);
      if (pDVar4 != type) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x12a,
                                    "(!successorType || !successorType->GetTypeHandler()->IsPathTypeHandler() || PathTypeHandlerBase::FromTypeHandler(successorType->GetTypeHandler())->GetPredecessorType() == type)"
                                    ,"We\'re using a successor that has a different predecessor?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  ppPVar7 = Memory::WriteBarrierPtr::operator_cast_to_PathTypeSuccessorInfo__
                      ((WriteBarrierPtr *)&this->successorInfo);
  if (*ppPVar7 == (PathTypeSuccessorInfo *)0x0) {
    ptr = PathTypeSingleSuccessorInfo::New(successorKey,typeWeakRef,scriptContext);
    Memory::WriteBarrierPtr<Js::PathTypeSuccessorInfo>::operator=
              (&this->successorInfo,&ptr->super_PathTypeSuccessorInfo);
  }
  else {
    this_01 = Memory::WriteBarrierPtr<Js::PathTypeSuccessorInfo>::operator->(&this->successorInfo);
    PathTypeSuccessorInfo::SetSuccessor(this_01,type,successorKey,typeWeakRef,scriptContext);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetSuccessor(DynamicType * type, const PathTypeSuccessorKey successorKey, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
#if DBG
        DynamicType * successorType = typeWeakRef->Get();
        AssertMsg(!successorType || !successorType->GetTypeHandler()->IsPathTypeHandler() ||
                  PathTypeHandlerBase::FromTypeHandler(successorType->GetTypeHandler())->GetPredecessorType() == type, "We're using a successor that has a different predecessor?");
#endif
        if (this->successorInfo == nullptr)
        {
            this->successorInfo = PathTypeSingleSuccessorInfo::New(successorKey, typeWeakRef, scriptContext);
            return;
        }
        this->successorInfo->SetSuccessor(type, successorKey, typeWeakRef, scriptContext);
    }